

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  size_type __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (arg->_M_string_length == 0) {
LAB_00107e3e:
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,arg,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    sVar2 = arg->_M_string_length;
    do {
      __pos = sVar2;
      if (__pos == 0) goto LAB_00107e3e;
      sVar2 = __pos - 1;
    } while ((arg->_M_dataplus)._M_p[__pos - 1] != '=');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_58,arg,0,__pos - 1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_38,arg,__pos,0xffffffffffffffff);
    paVar1 = &(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_58.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->first)._M_dataplus._M_p = local_58._M_dataplus._M_p;
      (__return_storage_ptr__->first).field_2._M_allocated_capacity =
           CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->first)._M_string_length = local_58._M_string_length;
    paVar1 = &(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      paVar1->_M_allocated_capacity = local_38.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_38.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->second)._M_dataplus._M_p = local_38._M_dataplus._M_p;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity =
           local_38.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->second)._M_string_length = local_38._M_string_length;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<text, text>
split_option( text arg )
{
    text::size_type pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_pair( arg, text() )
                : std::make_pair( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}